

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O3

void calc_similarity_from_indexer_with_references<float,unsigned_long>
               (float *numeric_data,int *categ_data,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,size_t nrows,int nthreads,bool standardize_dist,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *rmat,
               TreesIndexer *indexer,bool is_col_major,size_t ld_numeric,size_t ld_categ)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long *Xc_indptr_00;
  pointer puVar10;
  size_t sVar11;
  ExtIsoForest *pEVar12;
  long lVar13;
  double *pdVar14;
  unsigned_long *Xc_ind_00;
  runtime_error *this;
  long lVar15;
  size_t ref;
  float *Xr_indptr;
  size_t sVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  pointer __old_p;
  long lVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar23 [16];
  double div_trees;
  float *pfVar25;
  size_t local_1b8;
  undefined1 local_1a8 [32];
  float *local_188;
  double dStack_180;
  size_t local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> terminal_indices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_188 = numeric_data;
  sVar11 = get_number_of_reference_points(indexer);
  if (sVar11 != 0) {
    bVar21 = handle_is_locked == false;
    if (bVar21) {
      handle_is_locked = true;
      interrupt_switch = false;
      local_1a8._0_8_ = signal(2,set_interrup_global_variable);
    }
    pEVar12 = (ExtIsoForest *)model_outputs;
    if (model_outputs == (IsoForest *)0x0) {
      pEVar12 = model_outputs_ext;
    }
    pvVar1 = (pEVar12->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (pEVar12->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = (long)pvVar2 - (long)pvVar1 >> 3;
    lVar17 = lVar13 * -0x5555555555555555;
    local_1a8[8] = bVar21;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&terminal_indices,lVar17 * nrows,(allocator_type *)&local_90);
    pdVar14 = (double *)operator_new__(-(ulong)(nrows >> 0x3d != 0) | nrows * 8);
    pfVar18 = (float *)0x0;
    pfVar25 = (float *)0x0;
    if (is_col_major) {
      pfVar25 = Xc;
    }
    Xc_ind_00 = (unsigned_long *)0x0;
    if (is_col_major) {
      Xc_ind_00 = Xc_ind;
    }
    Xr_indptr = (float *)Xc_indptr;
    Xc_indptr_00 = (unsigned_long *)0x0;
    if (is_col_major) {
      Xr_indptr = pfVar18;
      Xc_ind = (unsigned_long *)pfVar18;
      Xc_indptr_00 = Xc_indptr;
      Xc = pfVar18;
    }
    predict_iforest<float,unsigned_long>
              (local_188,categ_data,is_col_major,ld_numeric,ld_categ,pfVar25,Xc_ind_00,Xc_indptr_00,
               Xc,Xc_ind,(unsigned_long *)Xr_indptr,nrows,nthreads,false,model_outputs,
               model_outputs_ext,pdVar14,
               terminal_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,(double *)0x0,indexer);
    operator_delete__(pdVar14);
    check_interrupt_switch((SignalSwitcher *)local_1a8);
    puVar10 = terminal_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar21 = interrupt_switch;
    if (nrows != 0) {
      local_170 = sVar11 * 8;
      local_1b8 = 0;
      pdVar14 = rmat;
      do {
        if ((bVar21 == false) && (memset(rmat + local_1b8 * sVar11,0,local_170), pvVar2 != pvVar1))
        {
          pSVar3 = (indexer->indices).
                   super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_188 = (float *)(puVar10 + local_1b8);
          lVar15 = 0;
          do {
            uVar4 = pSVar3[lVar15].n_terminal;
            if ((uVar4 & 1) == 0) {
              lVar19 = (uVar4 - 1) * (uVar4 >> 1);
            }
            else {
              lVar19 = (uVar4 - 1 >> 1) * uVar4;
            }
            lVar5 = *(long *)&pSVar3[lVar15].reference_points.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
            lVar6 = *(long *)&pSVar3[lVar15].node_distances.
                              super__Vector_base<double,_std::allocator<double>_>;
            lVar7 = *(long *)&pSVar3[lVar15].node_depths.
                              super__Vector_base<double,_std::allocator<double>_>;
            uVar8 = *(ulong *)(local_188 + lVar15 * nrows * 2);
            sVar16 = 0;
            do {
              uVar9 = *(ulong *)(lVar5 + sVar16 * 8);
              if (uVar8 == uVar9) {
                dVar24 = *(double *)(lVar7 + uVar8 * 8) + 3.0;
              }
              else {
                if (uVar8 < uVar9) {
                  lVar20 = uVar9 + (lVar19 - uVar8) +
                           ~(((uVar4 - uVar8) + -1) * (uVar4 - uVar8) >> 1);
                }
                else {
                  lVar20 = ((uVar8 + lVar19) - uVar9) +
                           ~(((uVar4 - uVar9) + -1) * (uVar4 - uVar9) >> 1);
                }
                dVar24 = *(double *)(lVar6 + lVar20 * 8);
              }
              pdVar14[sVar16] = dVar24 + pdVar14[sVar16];
              sVar16 = sVar16 + 1;
            } while (sVar11 != sVar16);
            lVar15 = lVar15 + 1;
          } while (lVar15 != lVar17 + (ulong)(lVar17 == 0));
        }
        local_1b8 = local_1b8 + 1;
        pdVar14 = (double *)((long)pdVar14 + local_170);
      } while (local_1b8 != nrows);
    }
    check_interrupt_switch((SignalSwitcher *)local_1a8);
    auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)lVar17);
    auVar22._8_4_ = (int)((ulong)lVar17 >> 0x20);
    auVar22._12_4_ = 0x45300000;
    lVar17 = sVar11 * nrows;
    dVar24 = auVar22._8_8_ - 1.9342813113834067e+25;
    pfVar25 = (float *)(dVar24 + (auVar22._0_8_ - 4503599627370496.0));
    if (standardize_dist) {
      if (lVar17 != 0) {
        lVar13 = lVar13 * 0x5555555555555556;
        auVar23._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar23._0_8_ = lVar13;
        auVar23._12_4_ = 0x45300000;
        lVar15 = 0;
        local_188 = pfVar25;
        dStack_180 = dVar24;
        do {
          dVar24 = exp2(-(rmat[lVar15] - (double)local_188) /
                        ((auVar23._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)));
          rmat[lVar15] = dVar24;
          lVar15 = lVar15 + 1;
        } while (lVar17 - lVar15 != 0);
      }
    }
    else if (lVar17 != 0) {
      lVar13 = 0;
      do {
        rmat[lVar13] = rmat[lVar13] / (double)pfVar25;
        lVar13 = lVar13 + 1;
      } while (lVar17 - lVar13 != 0);
    }
    check_interrupt_switch((SignalSwitcher *)local_1a8);
    if (terminal_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(terminal_indices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)terminal_indices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)terminal_indices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((local_1a8[8] == true) && (handle_is_locked == true)) {
      interrupt_switch = false;
      signal(2,(__sighandler_t)local_1a8._0_8_);
      handle_is_locked = false;
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Unexpected error in ","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/dist.hpp"
             ,"");
  std::operator+(&local_50,&local_110,&local_b0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,":","");
  std::operator+(&local_90,&local_50,&local_d0);
  std::__cxx11::to_string(&local_70,0x6c9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 &local_90,&local_70);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
             ,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &terminal_indices,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 &local_f0);
  std::runtime_error::runtime_error(this,(string *)&terminal_indices);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void calc_similarity_from_indexer_with_references
(
    real_t *restrict numeric_data, int *restrict categ_data,
    real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
    size_t nrows, int nthreads, bool standardize_dist,
    IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
    double *restrict rmat,
    TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ
)
{
    size_t n_ref = get_number_of_reference_points(*indexer);
    if (unlikely(!n_ref)) unexpected_error();

    SignalSwitcher ss;

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    std::vector<sparse_ix> terminal_indices(nrows * ntrees);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.data(),
                    (double*)NULL,
                    indexer);
    ignored.reset();

    #ifndef _OPENMP
    nthreads = 1;
    #endif

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(rmat, terminal_indices, nrows, n_ref, indexer, ntrees)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        size_t i, j;
        size_t n_terminal_this;
        size_t ncomb_this;
        size_t *restrict ref_this;
        sparse_ix *restrict ind_this;
        double *restrict node_depths_this;
        double *restrict node_dist_this;
        double *rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            ref_this = indexer->indices[tree].reference_points.data();
            ind_this = terminal_indices.data() + tree*nrows;
            node_depths_this = indexer->indices[tree].node_depths.data();
            n_terminal_this = indexer->indices[tree].n_terminal;
            node_dist_this = indexer->indices[tree].node_distances.data();
            ncomb_this = calc_ncomb(n_terminal_this);
            for (size_t ref = 0; ref < n_ref; ref++)
            {
                i = ind_this[row];
                j = ref_this[ref];

                if (unlikely(i == j))
                    rmat_this[ref] += node_depths_this[i] + 3.;
                else
                    rmat_this[ref] += node_dist_this[ix_comb(i, j, n_terminal_this, ncomb_this)];
            }
        }
    }

    check_interrupt_switch(ss);

    size_t size_rmat = nrows * n_ref;
    if (standardize_dist)
    {
        double ntrees_dbl = (double)ntrees;
        double div_trees = (double)(mult2(ntrees));
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] = std::exp2( - (rmat[ix] - ntrees_dbl) / div_trees);
    }

    else
    {
        double div_trees = (double)ntrees;
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] /= div_trees;
    }

    check_interrupt_switch(ss);
}